

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O2

int md_analyze_inlines(MD_CTX *ctx,MD_LINE *lines,MD_SIZE n_lines,int table_mode)

{
  MD_MARK *pMVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  uchar uVar5;
  MD_OFFSET off;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  MD_MARK *pMVar11;
  MD_CHAR *pMVar12;
  MD_LINE *pMVar13;
  void *pvVar14;
  ulong uVar15;
  undefined4 in_register_00000014;
  MD_MARK *pMVar16;
  byte bVar17;
  uint uVar18;
  MD_SIZE MVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  byte bVar23;
  MD_CHAR *pMVar24;
  MD_MARK *pMVar25;
  MD_MARK *pMVar26;
  MD_CTX *ctx_00;
  uint uVar27;
  MD_CHAR *pMVar28;
  char *p_contents_beg;
  MD_MARK *pMVar29;
  MD_OFFSET MVar30;
  MD_CHAR *pMVar31;
  MD_OFFSET *pMVar32;
  byte bVar33;
  MD_CHAR *pMVar34;
  MD_OFFSET *pMVar35;
  ulong uVar36;
  byte bVar37;
  uint uVar38;
  MD_MARK *pMVar39;
  MD_CHAR *pMVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  MD_SIZE *p_size;
  MD_CTX *pMVar44;
  MD_MARK *local_150;
  ulong local_140;
  MD_SIZE line_index;
  MD_LINE *local_130;
  MD_CHAR *local_128;
  MD_MARK *local_120;
  uint local_118;
  MD_SIZE tmp_line_index;
  undefined8 local_110;
  ulong local_108;
  ulong local_100;
  MD_OFFSET *local_f8;
  ulong local_f0;
  int local_e4;
  MD_OFFSET title_contents_end;
  MD_OFFSET title_contents_beg;
  MD_OFFSET *local_d8;
  MD_OFFSET *local_d0;
  MD_SIZE local_c4;
  undefined8 local_c0;
  MD_OFFSET codespan_last_potential_closers [32];
  
  local_110 = CONCAT44(in_register_00000014,n_lines);
  ctx->n_marks = 0;
  codespan_last_potential_closers[0x1c] = 0;
  codespan_last_potential_closers[0x1d] = 0;
  codespan_last_potential_closers[0x1e] = 0;
  codespan_last_potential_closers[0x1f] = 0;
  codespan_last_potential_closers[0x18] = 0;
  codespan_last_potential_closers[0x19] = 0;
  codespan_last_potential_closers[0x1a] = 0;
  codespan_last_potential_closers[0x1b] = 0;
  codespan_last_potential_closers[0x14] = 0;
  codespan_last_potential_closers[0x15] = 0;
  codespan_last_potential_closers[0x16] = 0;
  codespan_last_potential_closers[0x17] = 0;
  codespan_last_potential_closers[0x10] = 0;
  codespan_last_potential_closers[0x11] = 0;
  codespan_last_potential_closers[0x12] = 0;
  codespan_last_potential_closers[0x13] = 0;
  codespan_last_potential_closers[0xc] = 0;
  codespan_last_potential_closers[0xd] = 0;
  codespan_last_potential_closers[0xe] = 0;
  codespan_last_potential_closers[0xf] = 0;
  codespan_last_potential_closers[8] = 0;
  codespan_last_potential_closers[9] = 0;
  codespan_last_potential_closers[10] = 0;
  codespan_last_potential_closers[0xb] = 0;
  codespan_last_potential_closers[4] = 0;
  codespan_last_potential_closers[5] = 0;
  codespan_last_potential_closers[6] = 0;
  codespan_last_potential_closers[7] = 0;
  codespan_last_potential_closers[0] = 0;
  codespan_last_potential_closers[1] = 0;
  codespan_last_potential_closers[2] = 0;
  codespan_last_potential_closers[3] = 0;
  local_100 = (ulong)(n_lines - 1);
  local_f8 = &ctx->html_comment_horizon;
  local_d0 = &ctx->html_proc_instr_horizon;
  local_120 = (MD_MARK *)&ctx->html_decl_horizon;
  local_d8 = &ctx->html_cdata_horizon;
  local_f0 = local_f0 & 0xffffffff00000000;
  line_index = 0;
  ctx_00 = ctx;
  local_130 = lines;
  local_e4 = table_mode;
LAB_0010680a:
  if (line_index < (uint)local_110) {
    pMVar13 = local_130 + line_index;
    pMVar28 = (MD_CHAR *)(ulong)pMVar13->beg;
LAB_00106821:
    do {
      uVar8 = pMVar13->end;
      pMVar24 = (MD_CHAR *)(ulong)uVar8;
      while( true ) {
        uVar7 = (uint)pMVar28;
        pMVar34 = (MD_CHAR *)((ulong)pMVar28 & 0xffffffff);
        if ((((uVar8 <= uVar7 + 3) ||
             (pMVar28 = ctx->text, ctx->mark_char_map[(byte)pMVar34[(long)pMVar28]] != '\0')) ||
            (ctx->mark_char_map[(byte)pMVar28[uVar7 + 1]] != '\0')) ||
           ((ctx->mark_char_map[(byte)pMVar28[uVar7 + 2]] != '\0' ||
            (ctx->mark_char_map[(byte)pMVar28[uVar7 + 3]] != '\0')))) break;
        pMVar28 = (MD_CHAR *)(ulong)(uVar7 + 4);
      }
      uVar21 = uVar7 + 3;
      uVar18 = uVar7 + 2;
      uVar38 = uVar7;
      while( true ) {
        uVar38 = uVar38 + 1;
        uVar7 = uVar7 + 1;
        pMVar31 = (MD_CHAR *)(ulong)uVar38;
        pMVar12 = (MD_CHAR *)(ulong)uVar7;
        if (pMVar24 <= pMVar34) {
          line_index = line_index + 1;
          goto LAB_0010680a;
        }
        pMVar40 = ctx->text;
        if (ctx->mark_char_map[(byte)pMVar34[(long)pMVar40]] != '\0') break;
        pMVar34 = pMVar34 + 1;
        uVar21 = uVar21 + 1;
        uVar18 = uVar18 + 1;
      }
      uVar38 = (uint)pMVar34;
      pMVar28 = (MD_CHAR *)((ulong)pMVar34 & 0xffffffff);
      bVar17 = pMVar28[(long)pMVar40];
      uVar7 = (uint)bVar17;
      if (bVar17 != 0x5c) {
        switch(bVar17) {
        case 0x3a:
          MVar30 = pMVar13->beg;
          pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 1);
          local_128 = pMVar28 + (long)pMVar40;
          for (lVar22 = 8; lVar22 != 0x68; lVar22 = lVar22 + 0x20) {
            MVar19 = *(MD_SIZE *)((long)&md_collect_marks_scheme_map + lVar22);
            if (MVar19 + MVar30 <= uVar38) {
              ctx = ctx_00;
              iVar9 = md_ascii_eq(pMVar40 + (uVar38 - MVar19),
                                  *(MD_CHAR **)
                                   ((long)&md_get_unicode_fold_info::FOLD_MAP_LIST[2].n_codepoints +
                                   lVar22),MVar19);
              ctx_00 = ctx;
              if (((iVar9 != 0) && (uVar38 + 3 < uVar8)) &&
                 (iVar9 = md_ascii_eq(local_128,"//",2), ctx_00 = ctx, iVar9 != 0)) {
                pMVar11 = md_add_mark(ctx);
                if (pMVar11 == (MD_MARK *)0x0) {
                  return -1;
                }
                pMVar11->beg = uVar38 - MVar19;
                pMVar11->end = uVar38 + 3;
                pMVar11->prev = -1;
                pMVar11->next = -1;
                pMVar11->ch = ':';
                pMVar11->flags = '\x01';
                pMVar11 = md_add_mark(ctx);
                if (pMVar11 == (MD_MARK *)0x0) {
                  return -1;
                }
                MVar30 = pMVar13->end;
                pMVar11->beg = pMVar13->beg;
                pMVar11->end = MVar30;
                pMVar11->prev = -1;
                pMVar11->next = -1;
                pMVar11->ch = 'D';
                pMVar11->flags = '\0';
                pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 4);
                ctx_00 = ctx;
                break;
              }
            }
          }
          goto LAB_00106821;
        case 0x3b:
          if ((0 < (long)ctx->n_marks) && (ctx->marks[(long)ctx->n_marks + -1].ch == '&')) {
            pMVar11 = md_add_mark(ctx);
            ctx = ctx_00;
            if (pMVar11 == (MD_MARK *)0x0) {
              return -1;
            }
            pMVar11->beg = uVar38;
            pMVar11->end = uVar38 + 1;
            pMVar11->prev = -1;
            pMVar11->next = -1;
            pMVar11->ch = ';';
            pMVar11->flags = '\x02';
            ctx_00 = ctx;
          }
          break;
        case 0x3c:
          uVar8 = local_130[local_100].end;
          local_128 = pMVar28;
          if (((ctx->parser).flags & 0x40) != 0) goto LAB_00106fb0;
          MVar19 = (uint)local_110 - line_index;
          iVar9 = md_is_html_tag(ctx,pMVar13,MVar19,uVar38,uVar8,&tmp_line_index);
          if (iVar9 == 0) {
            local_108 = CONCAT44(local_108._4_4_,MVar19);
            uVar7 = pMVar13->end;
            if (((uVar38 + 4 < uVar7) && (pMVar40[uVar38 + 1] == '!')) &&
               ((pMVar40[uVar38 + 2] == '-' && (pMVar40[uVar38 + 3] == '-')))) {
              iVar9 = md_scan_for_html_closer
                                (ctx_00,"-->",3,pMVar13,MVar19,uVar38 + 2,uVar8,&tmp_line_index,
                                 local_f8);
              if (iVar9 != 0) goto LAB_00106c93;
              uVar7 = pMVar13->end;
              pMVar40 = ctx_00->text;
            }
            uVar10 = uVar38 + 2;
            if ((uVar10 < uVar7) && (pMVar40[uVar38 + 1] == '?')) {
              iVar9 = md_scan_for_html_closer
                                (ctx_00,"?>",2,pMVar13,(MD_SIZE)local_108,uVar10,uVar8,
                                 &tmp_line_index,local_d0);
              if (iVar9 != 0) goto LAB_00106c93;
              uVar7 = pMVar13->end;
              pMVar40 = ctx_00->text;
            }
            if (((uVar10 < uVar7) && (pMVar40[uVar38 + 1] == '!')) &&
               ((byte)((pMVar40[uVar10] & 0xdfU) + 0xbf) < 0x1a)) {
              for (uVar20 = (ulong)(uVar38 + 3); uVar20 < uVar7; uVar20 = uVar20 + 1) {
                if (0x19 < (byte)((pMVar40[uVar20] & 0xdfU) + 0xbf)) {
                  uVar7 = (uint)uVar20;
                  break;
                }
              }
              iVar9 = md_scan_for_html_closer
                                (ctx_00,">",1,pMVar13,(MD_SIZE)local_108,uVar7,uVar8,&tmp_line_index
                                 ,&local_120->beg);
              if (iVar9 != 0) goto LAB_00106c93;
              uVar7 = pMVar13->end;
              pMVar40 = ctx_00->text;
            }
            ctx = ctx_00;
            if ((uVar38 + 9 < uVar7) &&
               (iVar9 = bcmp(local_128 + (long)pMVar40,md_is_html_cdata_open_str,9), ctx = ctx_00,
               iVar9 == 0)) {
              iVar9 = md_scan_for_html_closer
                                (ctx_00,"]]>",3,pMVar13,(MD_SIZE)local_108,uVar38 + 9,uVar8,
                                 &tmp_line_index,local_d8);
              if (iVar9 != 0) goto LAB_00106c93;
              pMVar40 = ctx_00->text;
              ctx = ctx_00;
            }
            uVar8 = local_130[local_100].end;
            ctx_00 = ctx;
LAB_00106fb0:
            local_140 = (ulong)uVar8;
            uVar7 = uVar38 + 1;
            pMVar28 = (MD_CHAR *)(ulong)uVar7;
            uVar20 = (ulong)uVar7;
            if ((uVar7 < uVar8) && (-1 < pMVar40[uVar20])) {
              uVar36 = (ulong)(uVar38 + 2);
              uVar6 = uVar21;
              for (uVar10 = 2; (uVar36 < local_140 && (uVar10 < 0x21)); uVar10 = uVar10 + 1) {
                bVar17 = pMVar40[uVar36];
                if ((2 < uVar10) && (bVar17 == 0x3a)) goto LAB_0010748e;
                if (((9 < (byte)(bVar17 - 0x30)) && (0x19 < (byte)((bVar17 & 0xdf) + 0xbf))) &&
                   ((0x2e < bVar17 || ((0x680000000000U >> ((ulong)bVar17 & 0x3f) & 1) == 0))))
                break;
                uVar36 = uVar36 + 1;
                uVar6 = uVar6 + 1;
              }
            }
LAB_001074ca:
            do {
              if (local_140 <= uVar20) goto LAB_00106821;
              bVar17 = pMVar40[uVar20];
              if (((9 < (byte)(bVar17 - 0x30)) && (0x19 < (byte)((bVar17 & 0xdf) + 0xbf))) &&
                 ((bVar17 == 0 ||
                  (ctx = ctx_00, pvVar14 = memchr(".!#$%&\'*+/=?^_`{|}~-",(int)(char)bVar17,0x15),
                  ctx_00 = ctx, pvVar14 == (void *)0x0)))) {
                if ((uVar7 < (uint)uVar20) && (pMVar40[uVar20 & 0xffffffff] == '@')) {
                  uVar20 = (ulong)uVar18;
                  iVar9 = 0;
                  goto LAB_00107534;
                }
                goto LAB_00106821;
              }
              uVar20 = uVar20 + 1;
              uVar21 = uVar21 + 1;
              uVar18 = uVar18 + 1;
            } while( true );
          }
LAB_00106c93:
          pMVar44 = ctx_00;
          pMVar11 = md_add_mark(ctx_00);
          if (pMVar11 == (MD_MARK *)0x0) {
            return -1;
          }
          pMVar11->beg = uVar38;
          pMVar11->end = uVar38;
          pMVar11->prev = -1;
          pMVar11->next = -1;
          pMVar11->ch = '<';
          pMVar11->flags = '\x14';
          pMVar11 = md_add_mark(ctx_00);
          if (pMVar11 == (MD_MARK *)0x0) {
            return -1;
          }
          pMVar28 = (MD_CHAR *)(ulong)tmp_line_index;
          pMVar11->beg = tmp_line_index;
          pMVar11->end = tmp_line_index;
          pMVar11->prev = -1;
          pMVar11->next = -1;
          pMVar11->ch = '>';
          pMVar11->flags = '\x18';
          iVar9 = ctx_00->n_marks;
          pMVar11 = ctx_00->marks;
          pMVar11[(long)iVar9 + -2].next = iVar9 + -1;
          pMVar11[(long)iVar9 + -1].prev = iVar9 + -2;
          ctx = ctx_00;
          ctx_00 = pMVar44;
          if (pMVar13->end < tmp_line_index) {
            pMVar13 = md_lookup_line(tmp_line_index,local_130,(MD_SIZE)local_110,&line_index);
            ctx = pMVar44;
            ctx_00 = pMVar44;
          }
          goto LAB_00106821;
        case 0x3d:
        case 0x3e:
        case 0x3f:
          goto switchD_00106970_caseD_5c;
        case 0x40:
          if (pMVar13->beg + 1 <= uVar38) {
            if ((byte)((pMVar40[uVar38 - 1] & 0xdfU) + 0xbf) < 0x1a) {
              if (uVar38 + 3 < uVar8) {
LAB_001073b5:
                if (((byte)(pMVar28[(long)(pMVar40 + 1)] - 0x30U) < 10) ||
                   ((byte)((pMVar28[(long)(pMVar40 + 1)] & 0xdfU) + 0xbf) < 0x1a)) {
                  pMVar11 = md_add_mark(ctx);
                  if (pMVar11 == (MD_MARK *)0x0) {
                    return -1;
                  }
                  pMVar11->beg = uVar38;
                  pMVar11->end = uVar38 + 1;
                  pMVar11->prev = -1;
                  pMVar11->next = -1;
                  pMVar11->ch = '@';
                  pMVar11->flags = '\x01';
                  ctx = ctx_00;
                  pMVar11 = md_add_mark(ctx_00);
                  if (pMVar11 == (MD_MARK *)0x0) {
                    return -1;
                  }
                  MVar30 = pMVar13->end;
                  pMVar11->beg = pMVar13->beg;
                  pMVar11->end = MVar30;
                  pMVar11->prev = -1;
                  pMVar11->next = -1;
                  pMVar11->ch = 'D';
                  pMVar11->flags = '\0';
                  ctx_00 = ctx;
                }
              }
            }
            else if ((uVar38 + 3 < uVar8) && ((byte)(pMVar40[uVar38 - 1] - 0x30U) < 10))
            goto LAB_001073b5;
          }
          break;
        default:
          iVar9 = 1;
          switch(bVar17) {
          case 0x5b:
switchD_00106970_caseD_5b:
            pMVar11 = md_add_mark(ctx);
            if (pMVar11 == (MD_MARK *)0x0) {
              return -1;
            }
            uVar8 = iVar9 + uVar38;
            pMVar28 = (MD_CHAR *)(ulong)uVar8;
            pMVar11->beg = uVar38;
            pMVar11->end = uVar8;
            pMVar11->prev = -1;
            pMVar11->next = -1;
            pMVar11->ch = bVar17;
            pMVar11->flags = '\x01';
            pMVar11 = md_add_mark(ctx_00);
            if (pMVar11 == (MD_MARK *)0x0) {
              return -1;
            }
            pMVar11->beg = uVar8;
            pMVar11->end = uVar8;
            pMVar11->prev = -1;
            pMVar11->next = -1;
            pMVar11->ch = 'D';
            pMVar11->flags = '\0';
            pMVar11 = md_add_mark(ctx_00);
            if (pMVar11 == (MD_MARK *)0x0) {
              return -1;
            }
            pMVar11->beg = uVar8;
            pMVar11->end = uVar8;
            pMVar11->prev = -1;
            pMVar11->next = -1;
            pMVar11->ch = 'D';
            pMVar11->flags = '\0';
            ctx = ctx_00;
            goto LAB_00106821;
          case 0x5c:
          case 0x5e:
            goto switchD_00106970_caseD_5c;
          case 0x5d:
            pMVar11 = md_add_mark(ctx);
            ctx = ctx_00;
            if (pMVar11 == (MD_MARK *)0x0) {
              return -1;
            }
            pMVar11->beg = uVar38;
            pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 1);
            pMVar11->end = uVar38 + 1;
            pMVar11->prev = -1;
            pMVar11->next = -1;
            pMVar11->ch = ']';
            pMVar11->flags = '\x02';
            ctx_00 = ctx;
            goto LAB_00106821;
          case 0x5f:
switchD_00106970_caseD_5f:
            pMVar34 = pMVar12;
            if (pMVar12 < pMVar24) {
              pMVar34 = pMVar24;
            }
            for (; (pMVar28 = pMVar34, pMVar12 < pMVar24 &&
                   (pMVar28 = pMVar12, pMVar12[(long)pMVar40] == bVar17)); pMVar12 = pMVar12 + 1) {
            }
            bVar33 = 0;
            uVar7 = 0;
            bVar37 = 0;
            if (uVar38 != pMVar13->beg) {
              uVar7 = md_decode_utf8_before__(ctx,uVar38);
              local_128 = (MD_CHAR *)CONCAT44(local_128._4_4_,uVar7);
              ctx = ctx_00;
              iVar9 = md_is_unicode_whitespace__(uVar7);
              uVar7 = 0;
              bVar37 = 0;
              ctx_00 = ctx;
              if (iVar9 == 0) {
                iVar9 = md_is_unicode_punct__((uint)local_128);
                uVar7 = (uint)(iVar9 == 0);
                bVar37 = (iVar9 == 0) + 1;
                ctx_00 = ctx;
              }
            }
            bVar42 = false;
            uVar21 = (uint)pMVar28;
            if (uVar8 != uVar21) {
              MVar19 = ctx->size - uVar21;
              bVar42 = false;
              local_108 = CONCAT44(local_108._4_4_,MVar19);
              local_128 = (MD_CHAR *)CONCAT44(local_128._4_4_,uVar7);
              uVar8 = md_decode_utf8__(pMVar40 + ((ulong)pMVar28 & 0xffffffff),MVar19,(MD_SIZE *)0x0
                                      );
              ctx = ctx_00;
              iVar9 = md_is_unicode_whitespace__(uVar8);
              bVar33 = 0;
              uVar7 = (uint)local_128;
              ctx_00 = ctx;
              if (iVar9 == 0) {
                uVar8 = md_decode_utf8__(pMVar40 + ((ulong)pMVar28 & 0xffffffff),(MD_SIZE)local_108,
                                         (MD_SIZE *)0x0);
                iVar9 = md_is_unicode_punct__(uVar8);
                bVar42 = iVar9 == 0;
                bVar33 = bVar42 + 1;
                uVar7 = (uint)local_128;
                ctx_00 = ctx;
              }
            }
            if ((bVar17 == 0x5f & (byte)uVar7 & bVar42) != 0) {
              bVar37 = 0;
              bVar33 = 0;
            }
            if (bVar37 != 0 || bVar33 != 0) {
              pMVar11 = md_add_mark(ctx);
              if (pMVar11 == (MD_MARK *)0x0) {
                return -1;
              }
              bVar23 = (bVar33 <= bVar37) * '\x02';
              if (bVar37 == 0) {
                bVar23 = 0;
              }
              bVar23 = (bVar37 <= bVar33 && bVar33 != 0) | bVar23;
              if (bVar23 == 3) {
                bVar23 = 0x23;
              }
              pMVar11->beg = uVar38;
              pMVar11->end = uVar21;
              pMVar11->prev = -1;
              pMVar11->next = -1;
              pMVar11->ch = bVar17;
              uVar5 = (bVar23 | (byte)((uVar21 - uVar38) % 3 << 6)) + 0x40;
              pMVar28 = pMVar31;
              while( true ) {
                pMVar11->flags = uVar5;
                uVar8 = (uint)pMVar28;
                ctx = ctx_00;
                if (uVar21 <= uVar8) break;
                pMVar11 = md_add_mark(ctx_00);
                if (pMVar11 == (MD_MARK *)0x0) {
                  return -1;
                }
                pMVar11->beg = uVar8;
                pMVar11->end = uVar8;
                pMVar11->prev = -1;
                pMVar11->next = -1;
                pMVar11->ch = 'D';
                pMVar28 = (MD_CHAR *)(ulong)(uVar8 + 1);
                uVar5 = '\0';
              }
            }
            goto LAB_00106821;
          case 0x60:
            for (; pMVar28 < pMVar24; pMVar28 = pMVar28 + 1) {
              if (pMVar28[(long)pMVar40] != '`') {
                bVar42 = pMVar28[(long)pMVar40] == ' ';
                pMVar28 = (MD_CHAR *)((ulong)pMVar28 & 0xffffffff);
                goto LAB_00107059;
              }
            }
            bVar42 = false;
            pMVar28 = (MD_CHAR *)(ulong)uVar8;
LAB_00107059:
            MVar30 = (MD_OFFSET)pMVar28;
            uVar7 = MVar30 - uVar38;
            if (((uVar7 < 0x21) &&
                (codespan_last_potential_closers[uVar7 - 1] <
                 pMVar13[((uint)local_110 - line_index) - 1].end)) &&
               (((int)local_f0 == 0 || (MVar30 <= codespan_last_potential_closers[uVar7 - 1])))) {
              uVar20 = 0;
              bVar41 = true;
              pMVar34 = pMVar28;
LAB_0010709f:
              do {
                pMVar12 = pMVar34;
                if ((uint)pMVar34 <= (uint)pMVar24) {
                  pMVar12 = pMVar24;
                }
                for (; pMVar34 < pMVar24; pMVar34 = pMVar34 + 1) {
                  if (pMVar34[(long)pMVar40] != ' ') {
                    if (pMVar34[(long)pMVar40] == '`') {
                      pMVar12 = (MD_CHAR *)((ulong)pMVar34 & 0xffffffff);
                      break;
                    }
                    bVar41 = false;
                  }
                }
                uVar21 = (uint)pMVar12;
                pMVar34 = pMVar12;
                if (uVar21 < (uint)pMVar24) {
                  pMVar34 = pMVar24;
                }
                for (; pMVar12 < pMVar24; pMVar12 = pMVar12 + 1) {
                  if (pMVar12[(long)pMVar40] != '`') {
                    pMVar34 = (MD_CHAR *)((ulong)pMVar12 & 0xffffffff);
                    break;
                  }
                }
                uVar18 = (uint)pMVar34;
                uVar10 = uVar18 - uVar21;
                if (uVar7 == uVar10) {
                  if (pMVar13[uVar20].beg < uVar21) {
                    bVar43 = pMVar40[uVar21 - 1] == ' ';
                  }
                  else {
                    bVar43 = false;
                  }
                  if ((((bool)(uVar8 != MVar30 & (bVar42 ^ 1U))) || (bVar41)) ||
                     (uVar21 != pMVar13[uVar20].beg && !bVar43)) goto LAB_001077b1;
                  if (bVar42) {
                    MVar30 = MVar30 + 1;
                  }
                  else {
                    MVar30 = pMVar13[1].beg;
                  }
                  if (!bVar43) {
                    uVar8 = pMVar13[(int)uVar20 - 1].end;
                    uVar20 = (ulong)uVar8;
                    uVar7 = ctx_00->size;
                    uVar21 = uVar7;
                    if (uVar7 < uVar8) {
                      uVar21 = uVar8;
                    }
                    goto LAB_0010778f;
                  }
                  uVar21 = uVar21 - 1;
                  goto LAB_001077b1;
                }
                if ((uVar18 != uVar21) && (bVar41 = false, uVar10 < 0x20)) {
                  uVar18 = codespan_last_potential_closers[(ulong)uVar10 - 1];
                  if (codespan_last_potential_closers[(ulong)uVar10 - 1] < uVar21) {
                    uVar18 = uVar21;
                  }
                  codespan_last_potential_closers[(ulong)uVar10 - 1] = uVar18;
                }
              } while (pMVar12 < pMVar24);
              uVar21 = (int)uVar20 + 1;
              uVar20 = (ulong)uVar21;
              if (uVar21 < (uint)local_110 - line_index) {
                pMVar34 = (MD_CHAR *)(ulong)pMVar13[uVar21].beg;
                pMVar24 = (MD_CHAR *)(ulong)pMVar13[uVar21].end;
                goto LAB_0010709f;
              }
              local_f0 = CONCAT44(local_f0._4_4_,1);
              ctx = ctx_00;
            }
            goto LAB_00106821;
          default:
            if (bVar17 != 0x21) {
              if (bVar17 == 0x26) {
                pMVar11 = md_add_mark(ctx);
                if (pMVar11 == (MD_MARK *)0x0) {
                  return -1;
                }
                pMVar11->beg = uVar38;
                pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 1);
                pMVar11->end = uVar38 + 1;
                pMVar11->prev = -1;
                pMVar11->next = -1;
                pMVar11->ch = '&';
                pMVar11->flags = '\x01';
                ctx = ctx_00;
                goto LAB_00106821;
              }
              if (bVar17 == 0x2a) goto switchD_00106970_caseD_5f;
              if (uVar7 != 0x2e) goto switchD_00106970_caseD_5c;
              uVar8 = pMVar13->beg;
              if (uVar8 + 3 <= uVar38) {
                uVar7 = uVar38 - 3;
                ctx = ctx_00;
                iVar9 = md_ascii_eq(pMVar40 + uVar7,"www",3);
                ctx_00 = ctx;
                if (iVar9 != 0) {
                  if (uVar7 != uVar8) {
                    uVar8 = md_decode_utf8_before__(ctx,uVar7);
                    iVar9 = md_is_unicode_whitespace__(uVar8);
                    if ((iVar9 == 0) &&
                       (iVar9 = md_is_unicode_punct__(uVar8), ctx_00 = ctx, iVar9 == 0))
                    goto LAB_00106f90;
                  }
                  pMVar11 = md_add_mark(ctx);
                  if (pMVar11 == (MD_MARK *)0x0) {
                    return -1;
                  }
                  pMVar11->beg = uVar7;
                  pMVar11->end = uVar38 + 1;
                  pMVar11->prev = -1;
                  pMVar11->next = -1;
                  pMVar11->ch = '.';
                  pMVar11->flags = '\x01';
                  pMVar11 = md_add_mark(ctx);
                  if (pMVar11 == (MD_MARK *)0x0) {
                    return -1;
                  }
                  MVar30 = pMVar13->end;
                  pMVar11->beg = pMVar13->beg;
                  pMVar11->end = MVar30;
                  pMVar11->prev = -1;
                  pMVar11->next = -1;
                  pMVar11->ch = 'D';
                  pMVar11->flags = '\0';
                  pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 1);
                  ctx_00 = ctx;
                  goto LAB_00106821;
                }
              }
LAB_00106f90:
              pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 1);
              goto LAB_00106821;
            }
            if (((uint)(pMVar28 + 1) < uVar8) && (iVar9 = 2, (pMVar28 + 1)[(long)pMVar40] == '['))
            goto switchD_00106970_caseD_5b;
switchD_00106970_caseD_5c:
            if (local_e4 == 0) {
              if ((bVar17 != 0x7c) || (((ctx->parser).flags & 0x2000) == 0)) {
                if (uVar7 < 0x25) {
                  uVar20 = (ulong)uVar7;
                  if ((0x100001a00U >> (uVar20 & 0x3f) & 1) != 0) goto LAB_0010720a;
                  if (uVar20 == 0) goto LAB_0010736d;
                  if (uVar20 == 0x24) goto LAB_00107278;
                }
LAB_0010726e:
                if (bVar17 != 0x7e) break;
LAB_00107278:
                uVar8 = 1;
                do {
                  uVar7 = uVar8;
                  pMVar28 = pMVar34;
                  pMVar34 = pMVar28 + 1;
                  if (pMVar24 <= pMVar34) break;
                  uVar8 = uVar7 + 1;
                } while (pMVar28[(long)(pMVar40 + 1)] == bVar17);
                if (uVar7 < 3) {
                  bVar37 = 3;
                  if (pMVar13->beg < uVar38) {
                    local_128 = pMVar24;
                    uVar8 = md_decode_utf8_before__(ctx,uVar38);
                    ctx = ctx_00;
                    iVar9 = md_is_unicode_whitespace__(uVar8);
                    bVar37 = 3;
                    pMVar24 = local_128;
                    ctx_00 = ctx;
                    if (iVar9 == 0) {
                      iVar9 = md_is_unicode_punct__(uVar8);
                      bVar37 = 3 - (iVar9 == 0);
                      pMVar24 = local_128;
                      ctx_00 = ctx;
                    }
                  }
                  if (pMVar34 < pMVar24) {
                    MVar19 = ~(uint)pMVar28 + ctx->size;
                    uVar8 = md_decode_utf8__(pMVar40 + ((ulong)pMVar34 & 0xffffffff),MVar19,
                                             (MD_SIZE *)0x0);
                    ctx = ctx_00;
                    iVar9 = md_is_unicode_whitespace__(uVar8);
                    ctx_00 = ctx;
                    if (iVar9 == 0) {
                      uVar8 = md_decode_utf8__(pMVar40 + ((ulong)pMVar34 & 0xffffffff),MVar19,
                                               (MD_SIZE *)0x0);
                      iVar9 = md_is_unicode_punct__(uVar8);
                      ctx_00 = ctx;
                      if ((iVar9 == 0) && (bVar33 = bVar37 & 1, bVar37 = 1, bVar33 == 0)) {
                        pMVar28 = (MD_CHAR *)((ulong)pMVar34 & 0xffffffff);
                        goto LAB_00106821;
                      }
                    }
                  }
                  pMVar11 = md_add_mark(ctx);
                  if (pMVar11 == (MD_MARK *)0x0) {
                    return -1;
                  }
                  pMVar11->beg = uVar38;
                  pMVar11->end = (MD_OFFSET)pMVar34;
                  pMVar11->prev = -1;
                  pMVar11->next = -1;
                  pMVar11->ch = bVar17;
                  pMVar11->flags = bVar37;
                  pMVar28 = (MD_CHAR *)((ulong)pMVar34 & 0xffffffff);
                  ctx = ctx_00;
                  goto LAB_00106821;
                }
                pMVar28 = (MD_CHAR *)((ulong)pMVar34 & 0xffffffff);
                goto LAB_00106821;
              }
            }
            else {
              if (uVar7 < 0x25) {
                uVar20 = (ulong)uVar7;
                if ((0x100001a00U >> (uVar20 & 0x3f) & 1) == 0) {
                  if (uVar20 != 0) {
                    if (uVar20 != 0x24) goto LAB_001071a2;
                    goto LAB_00107278;
                  }
LAB_0010736d:
                  pMVar11 = md_add_mark(ctx);
                  if (pMVar11 == (MD_MARK *)0x0) {
                    return -1;
                  }
                  pMVar11->beg = uVar38;
                  pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 1);
                }
                else {
LAB_0010720a:
                  uVar7 = 1;
                  while ((((uint)pMVar31 < uVar8 && ((ulong)(byte)pMVar31[(long)pMVar40] < 0x21)) &&
                         ((0x100001a00U >> ((ulong)(byte)pMVar31[(long)pMVar40] & 0x3f) & 1) != 0)))
                  {
                    pMVar31 = pMVar31 + 1;
                    uVar7 = uVar7 + 1;
                  }
                  pMVar28 = pMVar31;
                  if (bVar17 == 0x20 && uVar7 < 2) goto LAB_00106821;
                  pMVar11 = md_add_mark(ctx);
                  if (pMVar11 == (MD_MARK *)0x0) {
                    return -1;
                  }
                  pMVar11->beg = uVar38;
                }
                pMVar11->end = (MD_OFFSET)pMVar28;
                pMVar11->prev = -1;
                pMVar11->next = -1;
                pMVar11->ch = bVar17;
                pMVar11->flags = '\x10';
                ctx = ctx_00;
                goto LAB_00106821;
              }
LAB_001071a2:
              if (uVar7 != 0x7c) goto LAB_0010726e;
            }
            pMVar11 = md_add_mark(ctx);
            if (pMVar11 == (MD_MARK *)0x0) {
              return -1;
            }
            pMVar11->beg = uVar38;
            pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 1);
            pMVar11->end = uVar38 + 1;
            pMVar11->prev = -1;
            pMVar11->next = -1;
            pMVar11->ch = bVar17;
            pMVar11->flags = '\0';
            ctx = ctx_00;
            goto LAB_00106821;
          }
        }
        pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 1);
        goto LAB_00106821;
      }
      if (ctx->size <= (uint)(pMVar28 + 1)) goto switchD_00106970_caseD_5c;
      bVar37 = (pMVar28 + 1)[(long)pMVar40];
      if ((((byte)(bVar37 - 0x21) < 0xf) ||
          ((bVar37 - 0x5b < 0x24 && ((0xf0000003fU >> ((ulong)(bVar37 - 0x5b) & 0x3f) & 1) != 0))))
         || (bVar37 - 0x3a < 7)) {
LAB_00106915:
        pMVar11 = md_add_mark(ctx);
        if (pMVar11 == (MD_MARK *)0x0) {
          return -1;
        }
        pMVar11->beg = uVar38;
        pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 2);
        pMVar11->end = uVar38 + 2;
        pMVar11->prev = -1;
        pMVar11->next = -1;
        pMVar11->ch = '\\';
        pMVar11->flags = '\x10';
        ctx = ctx_00;
      }
      else {
        if ((bVar37 != 0xd) && (bVar37 != 10)) goto switchD_00106970_caseD_5c;
        if (line_index + 1 < (uint)local_110) goto LAB_00106915;
        pMVar28 = (MD_CHAR *)(ulong)(uVar38 + 2);
      }
    } while( true );
  }
  pMVar11 = md_add_mark(ctx);
  if (pMVar11 == (MD_MARK *)0x0) {
    return -1;
  }
  MVar30 = ctx_00->size;
  pMVar11->beg = MVar30;
  pMVar11->end = MVar30;
  pMVar11->prev = -1;
  pMVar11->next = -1;
  pMVar11->ch = '\x7f';
  pMVar11->flags = '\x10';
  p_contents_beg = "[]!";
  local_128 = (MD_CHAR *)0x0;
  pMVar44 = ctx_00;
  md_analyze_marks(ctx_00,local_130,0,ctx_00->n_marks,0x10b9c0,(MD_CHAR *)0x0,(uint)ctx_00);
  uVar20 = (ulong)(uint)ctx_00->unresolved_link_head;
  uVar7 = 0;
  uVar8 = 0;
  uVar38 = 0;
  do {
    pMVar13 = local_130;
    iVar9 = (int)uVar20;
    if (iVar9 < 0) {
      ctx_00->opener_stacks[0xe].top = -1;
      ctx_00->unresolved_link_head = -1;
      ctx_00->unresolved_link_tail = -1;
      if (local_e4 == 0) {
        md_analyze_link_contents(ctx_00,local_130,0,ctx_00->n_marks,(int)p_contents_beg);
      }
      else {
        ctx_00->n_table_cell_boundaries = 0;
        md_analyze_marks(ctx_00,local_130,0,ctx_00->n_marks,0x10b9c4,(MD_CHAR *)0x0,(uint)pMVar44);
      }
      return 0;
    }
    pMVar11 = ctx_00->marks;
    pMVar32 = (MD_OFFSET *)(uVar20 * 0x14);
    pMVar29 = (MD_MARK *)(long)pMVar11[uVar20].prev;
    if ((long)pMVar29 < 0) {
      local_150 = (MD_MARK *)0x0;
      pMVar39 = (MD_MARK *)0x0;
    }
    else {
      local_150 = pMVar11 + (long)pMVar29;
      pMVar39 = pMVar11 + pMVar11[(long)pMVar29].next;
    }
    pMVar1 = (MD_MARK *)((long)pMVar32 + (long)pMVar11);
    uVar21 = pMVar11[uVar20].next;
    p_contents_beg = (char *)(ulong)uVar21;
    pMVar35 = (MD_OFFSET *)((long)(int)uVar21 * 0x14);
    pMVar16 = pMVar11 + (int)uVar21;
    uVar18 = pMVar1->beg;
    if ((((uVar18 < uVar38) && (pMVar16->end < uVar8)) ||
        ((uVar18 < uVar7 && (pMVar16->end < (uint)local_128)))) ||
       ((uVar18 < uVar8 && (pMVar1->ch == '[')))) goto LAB_001081df;
    local_100 = CONCAT44(local_100._4_4_,uVar21);
    local_f0 = uVar20;
    local_d8 = pMVar35;
    local_d0 = pMVar32;
    if ((((ctx_00->parser).flags & 0x2000) == 0) || (local_150 == (MD_MARK *)0x0)) {
LAB_00107b16:
      if (local_150 != (MD_MARK *)0x0) {
        uVar6 = local_150->beg;
        goto LAB_00107b27;
      }
      uVar21 = pMVar16->end;
LAB_00107c5d:
      if (uVar21 < ctx_00->size) {
        pMVar28 = ctx_00->text;
        uVar20 = (ulong)uVar21;
        if (pMVar28[uVar20] == '(') {
          local_f8 = (MD_OFFSET *)CONCAT44(local_f8._4_4_,uVar7);
          line_index = 0;
          local_108 = CONCAT44(local_108._4_4_,ctx_00->size);
          ctx_00 = pMVar44;
          local_120 = pMVar29;
          md_lookup_line(uVar21,local_130,(MD_SIZE)local_110,&line_index);
          pMVar32 = (MD_OFFSET *)(ulong)line_index;
          uVar7 = pMVar13[(long)pMVar32].end;
          uVar36 = (ulong)(uVar21 + 1);
          if (uVar21 + 1 < uVar7) {
            uVar36 = (ulong)uVar7;
          }
          do {
            uVar20 = uVar20 + 1;
            if (uVar7 <= uVar20) {
              local_118 = (uint)uVar36;
              if (((local_118 < (MD_SIZE)local_108) && (pMVar28[uVar36] != '\r')) &&
                 (pMVar28[uVar36] != '\n')) goto LAB_00107dbe;
              line_index = line_index + 1;
              p_contents_beg = (char *)(ulong)line_index;
              pMVar29 = local_120;
              uVar7 = (uint)local_f8;
              pMVar44 = ctx_00;
              if ((uint)local_110 <= line_index) goto LAB_0010804c;
              local_118 = local_130[(long)p_contents_beg].beg;
              uVar36 = (ulong)local_118;
              pMVar32 = (MD_OFFSET *)p_contents_beg;
              goto LAB_00107dbe;
            }
          } while (((ulong)(byte)pMVar28[uVar20] < 0x21) &&
                  ((0x100001a00U >> ((ulong)(byte)pMVar28[uVar20] & 0x3f) & 1) != 0));
          local_118 = (uint)uVar20;
          uVar36 = uVar20 & 0xffffffff;
LAB_00107dbe:
          uVar21 = (uint)uVar36;
          if ((uVar21 < (MD_SIZE)local_108) && (pMVar28[uVar36] == ')')) {
            codespan_last_potential_closers[1] = uVar21;
            codespan_last_potential_closers[0] = uVar21;
            codespan_last_potential_closers[2] = 0;
            codespan_last_potential_closers[3] = 0;
            codespan_last_potential_closers[4] = 0;
            codespan_last_potential_closers[5] = 0;
            bVar42 = true;
LAB_00107e08:
            uVar7 = (uint)local_f8;
LAB_00107e0d:
            uVar21 = uVar21 + 1;
            uVar20 = (ulong)(uint)local_100;
            do {
              do {
                uVar18 = (int)uVar20 + 1;
                uVar20 = (ulong)uVar18;
                pMVar29 = local_120;
                if (ctx_00->n_marks <= (int)uVar18) {
LAB_00107f74:
                  pMVar16->end = uVar21;
                  goto LAB_001080a7;
                }
                pMVar39 = ctx_00->marks;
                if (uVar21 <= pMVar39[(int)uVar18].beg) goto LAB_00107f74;
              } while ((~pMVar39[(int)uVar18].flags & 0x14) != 0);
              uVar20 = (ulong)pMVar39[(int)uVar18].next;
              p_contents_beg = (char *)(uVar20 * 0x14);
            } while (pMVar39[uVar20].beg < uVar21);
            pMVar44 = ctx_00;
            if (!bVar42) {
              free((void *)codespan_last_potential_closers._8_8_);
              pMVar29 = local_120;
              uVar7 = (uint)local_f8;
              pMVar44 = ctx_00;
            }
          }
          else {
            local_108 = CONCAT44(local_108._4_4_,local_130[(long)pMVar32].end);
            uVar18 = (uint)pMVar32;
            p_contents_beg = (char *)codespan_last_potential_closers;
            p_size = (MD_SIZE *)0x107ebb;
            iVar9 = md_is_link_destination
                              (ctx_00,uVar21,local_130[(long)pMVar32].end,&local_118,
                               (MD_OFFSET *)p_contents_beg,codespan_last_potential_closers + 1);
            pMVar13 = local_130;
            pMVar29 = local_120;
            uVar7 = (uint)local_f8;
            pMVar44 = ctx_00;
            if (iVar9 != 0) {
              iVar9 = md_is_link_title(ctx_00,local_130 + (long)pMVar32,(int)local_110 - uVar18,
                                       local_118,&local_118,&local_c4,&tmp_line_index,
                                       &title_contents_beg,&title_contents_end);
              if (iVar9 == 0) {
                title_contents_beg = local_118;
                title_contents_end = local_118;
                uVar10 = 0;
                uVar21 = (MD_SIZE)local_108;
              }
              else {
                uVar10 = local_c4 + uVar18;
                uVar18 = tmp_line_index + uVar18;
                uVar21 = pMVar13[uVar18].end;
                line_index = uVar18;
              }
              p_contents_beg = (char *)0x100001a00;
              for (uVar20 = (ulong)local_118; pMVar29 = local_120, uVar7 = (uint)local_f8,
                  pMVar44 = ctx_00, uVar20 < uVar21; uVar20 = uVar20 + 1) {
                if ((0x20 < (ulong)(byte)pMVar28[uVar20]) ||
                   ((0x100001a00U >> ((ulong)(byte)pMVar28[uVar20] & 0x3f) & 1) == 0))
                goto LAB_00107ff9;
              }
              line_index = uVar18 + 1;
              if (line_index < (uint)local_110) {
                uVar20 = (ulong)local_130[line_index].beg;
LAB_00107ff9:
                uVar21 = (uint)uVar20;
                if (pMVar28[uVar20 & 0xffffffff] == ')') {
                  if (title_contents_beg < title_contents_end) {
                    if (iVar9 != 0 && tmp_line_index != local_c4) {
                      iVar9 = md_merge_lines_alloc
                                        (ctx_00,title_contents_beg,title_contents_end,
                                         local_130 + uVar10,10,
                                         (char)codespan_last_potential_closers + '\b',
                                         (MD_CHAR **)(codespan_last_potential_closers + 4),p_size);
                      if (iVar9 < 0) {
                        return -1;
                      }
                      codespan_last_potential_closers[5] = 1;
                      bVar42 = false;
                      goto LAB_00107e08;
                    }
                    codespan_last_potential_closers._8_8_ = pMVar28 + title_contents_beg;
                    codespan_last_potential_closers[5] = 0;
                    codespan_last_potential_closers[4] = title_contents_end - title_contents_beg;
                    bVar42 = true;
                  }
                  else {
                    codespan_last_potential_closers[2] = 0;
                    codespan_last_potential_closers[3] = 0;
                    codespan_last_potential_closers[4] = 0;
                    codespan_last_potential_closers[5] = 0;
                    bVar42 = true;
                  }
                  goto LAB_00107e0d;
                }
              }
            }
          }
        }
      }
LAB_0010804c:
      if ((pMVar1->flags & 0x20) == 0) {
        p_contents_beg = (char *)(ulong)uVar38;
        iVar9 = md_is_link_reference
                          (ctx_00,local_130,(MD_SIZE)local_110,pMVar1->beg,pMVar16->end,
                           (MD_LINK_ATTR *)codespan_last_potential_closers);
        ctx_00 = pMVar44;
        if (iVar9 < 0) {
          return -1;
        }
        pMVar44 = ctx_00;
        if (iVar9 != 0) {
LAB_001080a7:
          pMVar1->flags = pMVar1->flags | 0x14;
          pMVar16->flags = pMVar16->flags | 0x18;
          pMVar25 = ctx_00->marks;
          uVar21 = (int)local_f0 + 1;
          pMVar39 = pMVar25 + uVar21;
          pMVar39->beg = codespan_last_potential_closers[0];
          pMVar39->end = codespan_last_potential_closers[1];
          uVar18 = (int)local_f0 + 2;
          pMVar25 = pMVar25 + uVar18;
          pMVar25->beg = codespan_last_potential_closers[2];
          pMVar25->end = codespan_last_potential_closers[3];
          pMVar39 = ctx_00->marks;
          if (codespan_last_potential_closers[5] != 0) {
            pMVar39[uVar18].next = (ctx_00->ptr_stack).top;
            (ctx_00->ptr_stack).top = uVar18;
          }
          pMVar39[uVar18].prev = codespan_last_potential_closers[4];
          local_128 = (MD_CHAR *)((ulong)local_128 & 0xffffffff);
          uVar18 = pMVar16->end;
          uVar10 = pMVar1->beg;
          if (pMVar1->ch != '[') {
            local_128 = (MD_CHAR *)(ulong)pMVar16->end;
            uVar18 = uVar8;
            uVar7 = pMVar1->beg;
            uVar10 = uVar38;
          }
          uVar38 = uVar10;
          uVar8 = uVar18;
          p_contents_beg = (char *)(ulong)uVar38;
          local_120 = pMVar29;
          md_analyze_link_contents(ctx_00,local_130,uVar21,(uint)local_100,uVar38);
          pMVar29 = local_120;
          pMVar44 = ctx_00;
          if (((ctx_00->parser).flags & 0x40c) != 0) {
            pMVar39 = (MD_MARK *)((long)local_d0 + (long)pMVar11);
            do {
              pMVar25 = pMVar39;
              pMVar39 = pMVar25 + 1;
              cVar2 = pMVar25[1].ch;
              if (cVar2 != 0x44) break;
            } while (pMVar39 < pMVar16);
            lVar22 = (long)&pMVar11->beg + (long)local_d8;
            pMVar11 = (MD_MARK *)((long)local_d8 + (long)pMVar11);
            do {
              pMVar26 = pMVar11;
              lVar22 = lVar22 + -0x14;
              if (cVar2 != 'D') break;
              pMVar11 = pMVar26 + -1;
            } while (pMVar1 < pMVar26 + -1);
            bVar17 = pMVar25[1].flags;
            if (((((bVar17 & 0x10) != 0) && (cVar2 != '\0')) && (pMVar39->beg == pMVar1->end)) &&
               (((pvVar14 = memchr("@:.",(int)cVar2,4), pMVar29 = local_120, pMVar44 = ctx_00,
                 pvVar14 != (void *)0x0 &&
                 ((lVar22 - (long)ctx_00->marks) / 0x14 == (long)pMVar25[1].next)) &&
                (pMVar26[-1].end == pMVar16->beg)))) {
              pMVar25[1].ch = 'D';
              pMVar25[1].flags = bVar17 & 0xef;
              pMVar26[-1].ch = 'D';
              pMVar26[-1].flags = pMVar26[-1].flags & 0xef;
            }
          }
        }
      }
    }
    else {
      uVar10 = pMVar1->end;
      uVar36 = (ulong)uVar10;
      if (uVar10 - uVar18 != 1) goto LAB_00107b16;
      uVar6 = local_150->beg;
      if ((((local_150->ch == '[') && (uVar6 == uVar18 - 1)) && (local_150->end - uVar6 == 1)) &&
         ((pMVar39 != (MD_MARK *)0x0 && (pMVar39->ch == ']')))) {
        uVar3 = pMVar16->beg;
        uVar15 = (ulong)uVar3;
        uVar27 = uVar3 + 1;
        if (pMVar39->beg == uVar27) {
          uVar27 = pMVar39->end - pMVar39->beg;
          if (uVar27 == 1) {
            local_c0 = (MD_MARK *)&pMVar1->end;
            while( true ) {
              iVar4 = (int)uVar20;
              uVar27 = iVar4 + 1;
              if ((int)uVar21 <= (int)uVar27) break;
              uVar20 = (ulong)uVar27;
              if (pMVar11[(int)uVar27].ch != 'D') {
                pMVar25 = pMVar11 + (int)uVar27;
                if (pMVar11[(int)uVar27].ch == '|') goto LAB_00108308;
                if (100 < pMVar25->beg - uVar10) {
                  pMVar25 = (MD_MARK *)0x0;
                  goto LAB_00108308;
                }
                if ((pMVar25->flags & 4) != 0) {
                  uVar20 = (ulong)(uint)pMVar25->next;
                }
              }
            }
            pMVar25 = (MD_MARK *)0x0;
LAB_00108308:
            pMVar26 = pMVar25;
            if (pMVar25 == (MD_MARK *)0x0) {
              pMVar26 = pMVar16;
            }
            uVar10 = pMVar26->beg - uVar10;
            p_contents_beg = (char *)(ulong)uVar10;
            local_120 = pMVar25;
            local_108 = uVar15;
            if ((uVar10 != 0) && (uVar10 < 0x65)) {
              for (; uVar36 < pMVar26->beg; uVar36 = uVar36 + 1) {
                bVar17 = ctx_00->text[uVar36];
                p_contents_beg = (char *)(ulong)bVar17;
                if ((bVar17 == 10) || (bVar17 == 0xd)) goto LAB_00107b16;
              }
              if (pMVar25 == (MD_MARK *)0x0) {
                bVar42 = true;
                uVar8 = pMVar39->end;
              }
              else {
                local_f8 = (MD_OFFSET *)CONCAT44(local_f8._4_4_,uVar7);
                bVar41 = pMVar25->end < uVar3;
                bVar42 = !bVar41;
                if (bVar41) {
                  md_rollback(ctx_00,iVar9,uVar27,1);
                  md_rollback(pMVar44,uVar27,(uint)local_100,0);
                  pMVar25->flags = pMVar25->flags | 0x10;
                  pMVar11 = local_c0;
                  ctx_00 = pMVar44;
                }
                else {
                  md_rollback(ctx_00,iVar9,uVar21,1);
                  pMVar11 = pMVar16;
                  ctx_00 = pMVar44;
                }
                pMVar11->beg = pMVar25->beg;
                uVar6 = local_150->beg;
                iVar9 = (int)local_f0;
                uVar7 = (uint)local_f8;
                uVar8 = pMVar39->end;
                uVar21 = (uint)local_100;
                pMVar44 = ctx_00;
              }
              pMVar1->beg = uVar6;
              pMVar1->next = uVar21;
              pMVar1->flags = pMVar1->flags | 0x14;
              pMVar16->end = uVar8;
              pMVar16->prev = iVar9;
              pMVar16->flags = pMVar16->flags | 0x18;
              if (!bVar42) {
                md_analyze_link_contents(ctx_00,local_130,iVar4 + 2,uVar21,(int)p_contents_beg);
                ctx_00 = pMVar44;
                pMVar44 = ctx_00;
              }
              pMVar29 = (MD_MARK *)(ulong)(uint)local_150->prev;
              uVar38 = uVar6;
              goto LAB_001081df;
            }
            goto LAB_00107b16;
          }
        }
        p_contents_beg = (char *)(ulong)uVar27;
      }
LAB_00107b27:
      uVar21 = pMVar16->end;
      if (uVar6 != uVar21) goto LAB_00107c5d;
      if (pMVar39->beg <= uVar6 + 1) {
        if ((pMVar1->flags & 0x20) != 0) goto LAB_001081df;
LAB_00107d1e:
        p_contents_beg = (char *)(ulong)uVar6;
        iVar9 = md_is_link_reference
                          (ctx_00,local_130,(MD_SIZE)local_110,uVar18,uVar6,
                           (MD_LINK_ATTR *)codespan_last_potential_closers);
        ctx_00 = pMVar44;
        if (iVar9 < 0) {
          return -1;
        }
        pMVar44 = ctx_00;
        if (iVar9 == 0) goto LAB_001081df;
        pMVar16->end = pMVar39->end;
        pMVar29 = (MD_MARK *)(ulong)(uint)ctx_00->marks[(long)pMVar29].prev;
        goto LAB_001080a7;
      }
      if ((local_150->flags & 0x20) == 0) {
        uVar18 = uVar6;
        uVar6 = pMVar39->end;
        goto LAB_00107d1e;
      }
    }
LAB_001081df:
    uVar20 = (ulong)pMVar29 & 0xffffffff;
  } while( true );
LAB_0010778f:
  if (uVar7 <= uVar20) goto LAB_001077b1;
  if ((pMVar40[uVar20] != ' ') && (pMVar40[uVar20] != '\t')) {
    uVar21 = (uint)uVar20;
    goto LAB_001077b1;
  }
  uVar20 = uVar20 + 1;
  goto LAB_0010778f;
LAB_001077b1:
  pMVar11 = md_add_mark(ctx_00);
  if (pMVar11 == (MD_MARK *)0x0) {
    return -1;
  }
  pMVar11->beg = uVar38;
  pMVar11->end = MVar30;
  pMVar11->prev = -1;
  pMVar11->next = -1;
  pMVar11->ch = '`';
  pMVar11->flags = '\x01';
  pMVar11 = md_add_mark(ctx_00);
  if (pMVar11 == (MD_MARK *)0x0) {
    return -1;
  }
  pMVar11->beg = uVar21;
  pMVar11->end = uVar18;
  pMVar11->prev = -1;
  pMVar11->next = -1;
  pMVar11->ch = '`';
  pMVar11->flags = '\x02';
  pMVar44 = ctx_00;
  md_resolve_range(ctx_00,ctx_00->n_marks + -2,ctx_00->n_marks + -1);
  ctx = ctx_00;
  pMVar28 = pMVar34;
  ctx_00 = pMVar44;
  if (pMVar13->end < uVar18) {
    pMVar13 = md_lookup_line(uVar18,local_130,(MD_SIZE)local_110,&line_index);
    ctx = pMVar44;
    ctx_00 = pMVar44;
  }
  goto LAB_00106821;
LAB_0010748e:
  if (local_140 <= uVar36) goto LAB_001074ca;
  bVar17 = pMVar40[uVar36];
  uVar15 = (ulong)bVar17;
  if (uVar15 < 0x3f) {
    if ((0x100001a00U >> (uVar15 & 0x3f) & 1) != 0) goto LAB_001074ca;
    if (uVar15 == 0x3e) {
      bVar17 = 0x30;
      uVar21 = uVar6;
      goto LAB_00107960;
    }
  }
  if (((bVar17 < 0x20) || (bVar17 == 0x3c)) || (bVar17 == 0x7f)) goto LAB_001074ca;
  uVar36 = uVar36 + 1;
  uVar6 = uVar6 + 1;
  goto LAB_0010748e;
LAB_00107534:
  if (uVar8 <= (uint)uVar20) goto LAB_00106821;
  bVar17 = pMVar40[uVar20];
  if ((((byte)(bVar17 - 0x30) < 10) || ((byte)((bVar17 & 0xdf) + 0xbf) < 0x1a)) ||
     ((0 < iVar9 && (bVar17 == 0x2d)))) {
    iVar9 = iVar9 + 1;
  }
  else {
    if ((iVar9 < 1) || (bVar17 != 0x2e)) {
      if ((0 < iVar9) && ((bVar17 == 0x3e && (bVar17 = 0x70, pMVar40[uVar21 - 2] != '-')))) {
LAB_00107960:
        pMVar11 = md_add_mark(ctx);
        if (pMVar11 == (MD_MARK *)0x0) {
          return -1;
        }
        pMVar11->beg = uVar38;
        pMVar11->end = uVar7;
        pMVar11->prev = -1;
        pMVar11->next = -1;
        pMVar11->ch = '<';
        pMVar11->flags = bVar17 | 4;
        pMVar11 = md_add_mark(ctx_00);
        if (pMVar11 == (MD_MARK *)0x0) {
          return -1;
        }
        pMVar11->beg = uVar21 - 1;
        pMVar11->end = uVar21;
        pMVar11->prev = -1;
        pMVar11->next = -1;
        pMVar11->ch = '>';
        pMVar11->flags = bVar17 | 8;
        iVar9 = ctx_00->n_marks;
        pMVar11 = ctx_00->marks;
        pMVar11[(long)iVar9 + -2].next = iVar9 + -1;
        pMVar11[(long)iVar9 + -1].prev = iVar9 + -2;
        pMVar28 = (MD_CHAR *)(ulong)uVar21;
        ctx = ctx_00;
      }
      goto LAB_00106821;
    }
    iVar9 = 0;
    if (pMVar40[uVar21 - 2] == '-') goto LAB_00106821;
  }
  uVar21 = uVar21 + 1;
  uVar20 = uVar20 + 1;
  if (0x3f < iVar9) goto LAB_00106821;
  goto LAB_00107534;
}

Assistant:

static int
md_analyze_inlines(MD_CTX* ctx, const MD_LINE* lines, MD_SIZE n_lines, int table_mode)
{
    int ret;

    /* Reset the previously collected stack of marks. */
    ctx->n_marks = 0;

    /* Collect all marks. */
    MD_CHECK(md_collect_marks(ctx, lines, n_lines, table_mode));

    /* (1) Links. */
    md_analyze_marks(ctx, lines, n_lines, 0, ctx->n_marks, _T("[]!"), 0);
    MD_CHECK(md_resolve_links(ctx, lines, n_lines));
    BRACKET_OPENERS.top = -1;
    ctx->unresolved_link_head = -1;
    ctx->unresolved_link_tail = -1;

    if(table_mode) {
        /* (2) Analyze table cell boundaries. */
        MD_ASSERT(n_lines == 1);
        ctx->n_table_cell_boundaries = 0;
        md_analyze_marks(ctx, lines, n_lines, 0, ctx->n_marks, _T("|"), 0);
        return ret;
    }

    /* (3) Emphasis and strong emphasis; permissive autolinks. */
    md_analyze_link_contents(ctx, lines, n_lines, 0, ctx->n_marks);

abort:
    return ret;
}